

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  uint uVar1;
  ImGuiWindow *window;
  ImDrawList *pIVar2;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  int iVar6;
  int iVar7;
  ImDrawList **ppIVar8;
  ulong uVar9;
  ImGuiWindow *pIVar10;
  int n;
  ulong uVar11;
  int n_1;
  long lVar12;
  ImGuiWindow *windows_to_render_front_most [2];
  ImGuiWindow *local_38 [2];
  
  pIVar3 = GImGui;
  iVar6 = GImGui->FrameCountEnded;
  if (iVar6 != GImGui->FrameCount) {
    EndFrame();
    iVar6 = pIVar3->FrameCount;
  }
  pIVar3->FrameCountRendered = iVar6;
  (pIVar3->IO).MetricsRenderWindows = 0;
  (pIVar3->IO).MetricsRenderVertices = 0;
  (pIVar3->IO).MetricsRenderIndices = 0;
  out_list = &pIVar3->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  pIVar10 = pIVar3->NavWindowingTarget;
  if (pIVar10 == (ImGuiWindow *)0x0) {
    local_38[0] = (ImGuiWindow *)0x0;
    pIVar10 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar10->Flags & 0x2000) == 0) {
      local_38[0] = pIVar10->RootWindow;
    }
    else {
      local_38[0] = (ImGuiWindow *)0x0;
    }
    pIVar10 = pIVar3->NavWindowingList;
  }
  pIVar5 = local_38[0];
  local_38[1] = pIVar10;
  for (uVar11 = 0; uVar11 != (uint)(pIVar3->Windows).Size; uVar11 = uVar11 + 1) {
    window = (pIVar3->Windows).Data[uVar11];
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar10 && window != pIVar5) && (window->Flags & 0x1000000) == 0)) {
      AddWindowToDrawDataSelectLayer(window);
    }
  }
  for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
    pIVar10 = local_38[lVar12];
    if (((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->Active == true)) && (pIVar10->Hidden == false)
       ) {
      AddWindowToDrawDataSelectLayer(pIVar10);
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar3->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar3->OverlayDrawList,(pIVar3->IO).MousePos,
                      (pIVar3->Style).MouseCursorScale,pIVar3->MouseCursor);
  }
  if ((pIVar3->OverlayDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar3->OverlayDrawList);
  }
  pIVar4 = GImGui;
  (pIVar3->DrawData).Valid = true;
  uVar1 = (pIVar3->DrawDataBuilder).Layers[0].Size;
  iVar6 = 0;
  if ((int)uVar1 < 1) {
    ppIVar8 = (ImDrawList **)0x0;
  }
  else {
    ppIVar8 = (pIVar3->DrawDataBuilder).Layers[0].Data;
  }
  (pIVar3->DrawData).CmdLists = ppIVar8;
  (pIVar3->DrawData).CmdListsCount = uVar1;
  (pIVar3->DrawData).TotalIdxCount = 0;
  (pIVar3->DrawData).TotalVtxCount = 0;
  (pIVar3->DrawData).DisplayPos.x = 0.0;
  (pIVar3->DrawData).DisplayPos.y = 0.0;
  (pIVar3->DrawData).DisplaySize = (pIVar4->IO).DisplaySize;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  iVar7 = 0;
  uVar9 = 0;
  while( true ) {
    if (uVar11 == uVar9) break;
    pIVar2 = (pIVar3->DrawDataBuilder).Layers[0].Data[uVar9];
    iVar7 = iVar7 + (pIVar2->VtxBuffer).Size;
    (pIVar3->DrawData).TotalVtxCount = iVar7;
    iVar6 = iVar6 + (pIVar2->IdxBuffer).Size;
    (pIVar3->DrawData).TotalIdxCount = iVar6;
    uVar9 = uVar9 + 1;
  }
  (pIVar3->IO).MetricsRenderVertices = iVar7;
  (pIVar3->IO).MetricsRenderIndices = iVar6;
  if ((0 < (int)uVar1) &&
     (UNRECOVERED_JUMPTABLE = (pIVar3->IO).RenderDrawListsFn,
     UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(&pIVar3->DrawData);
    return;
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* windows_to_render_front_most[2];
    windows_to_render_front_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_front_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_front_most[0] && window != windows_to_render_front_most[1])
            AddWindowToDrawDataSelectLayer(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_front_most); n++)
        if (windows_to_render_front_most[n] && IsWindowActiveAndVisible(windows_to_render_front_most[n])) // NavWindowingTarget is always temporarily displayed as the front-most window
            AddWindowToDrawDataSelectLayer(windows_to_render_front_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.OverlayDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor);

    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}